

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOFunction.cpp
# Opt level: O1

void PSOAdaption(Particle *particle,myRep *rep,double w,int it)

{
  double **p2;
  double **tmp;
  uint n;
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  n = particle->sizeOfPosition;
  iVar5 = rouletteWheel(rep);
  p2 = &particle->Position;
  cpyDoubleArray(&particle->old_position,p2,n);
  dVar4 = c2;
  dVar3 = c1;
  iVar6 = 0;
  if (0 < iVar5) {
    iVar6 = iVar5;
  }
  iVar6 = iVar6 + 1;
  do {
    rep = (myRep *)(((_List_base<Rep,_std::allocator<Rep>_> *)&((_List_node_base *)rep)->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (0 < (int)n) {
    uVar8 = 0;
    do {
      iVar6 = rand();
      iVar5 = rand();
      if ((it == 0) && ((int)(uVar8 / 3) * 3 + 1 != (int)uVar8)) {
        iVar7 = rand();
        particle->Velocity[uVar8] = (double)iVar7 / 2147483647.0;
      }
      particle->Velocity[uVar8] =
           (*(double *)((long)((_List_node_base *)((long)rep + 0x20))->_M_next + uVar8 * 8) -
           particle->Position[uVar8]) * ((double)iVar5 / 2147483647.0) * dVar4 +
           particle->Velocity[uVar8] * w +
           ((particle->Best).Position[uVar8] - particle->Position[uVar8]) *
           ((double)iVar6 / 2147483647.0) * dVar3;
      uVar8 = uVar8 + 1;
    } while (n != uVar8);
  }
  tmp = &particle->Velocity;
  checkV(tmp,particle->sizeOfVelocity);
  if (0 < (int)n) {
    pdVar1 = *tmp;
    pdVar2 = *p2;
    uVar8 = 0;
    do {
      pdVar2[uVar8] = pdVar1[uVar8] + pdVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while (n != uVar8);
  }
  checkP(p2,tmp,particle->sizeOfPosition);
  return;
}

Assistant:

void PSOAdaption(Particle & particle, myRep & rep, double w, int it) {
    int len = particle.sizeOfPosition;
    int h = rouletteWheel(rep);
    cpyDoubleArray(particle.old_position, particle.Position, len);
    myRep ::iterator a = rep.begin();
    for (int i=0; i<h; i++) a++;
    //  calculate the new Velocity
    for (int i=0; i<len; i++){
        double r1 = rand() / double(RAND_MAX) , r2 = rand() / double(RAND_MAX) ;
        //double r1=0.7, r2=0.7;
        if(it==0 && i%3 != 1) particle.Velocity[i] = rand() / double(RAND_MAX);
        //if(it==0 && i%3 != 1) particle.Velocity[i] = 0.7;
        particle.Velocity[i] = w * particle.Velocity[i] +
                               c1*r1* (particle.Best.Position[i] - particle.Position[i]) +
                               c2*r2 * (a->Position[i] - particle.Position[i]);
    }

    checkV(particle.Velocity, particle.sizeOfVelocity);

    //  calculate the new position
    for (int i=0; i<len; i++)   particle.Position[i] += particle.Velocity[i];

    checkP(particle.Position, particle.Velocity, particle.sizeOfPosition);
}